

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O1

optional<const_google::protobuf::FieldDescriptor_*> __thiscall
google::protobuf::json_internal::Proto2Descriptor::FieldByName
          (Proto2Descriptor *this,Desc *d,string_view name)

{
  Desc *__n;
  int iVar1;
  _Storage<const_google::protobuf::FieldDescriptor_*,_true> _Var2;
  _Storage<const_google::protobuf::FieldDescriptor_*,_true> _Var3;
  ulong uVar4;
  bool bVar5;
  undefined8 unaff_RBX;
  undefined7 uVar6;
  int index;
  string_view camelcase_name;
  string_view name_00;
  optional<const_google::protobuf::FieldDescriptor_*> oVar7;
  
  camelcase_name._M_str = (char *)name._M_len;
  camelcase_name._M_len = (size_t)d;
  _Var2._M_value = Descriptor::FindFieldByCamelcaseName((Descriptor *)this,camelcase_name);
  uVar6 = (undefined7)((ulong)unaff_RBX >> 8);
  uVar4 = CONCAT71(uVar6,1);
  _Var3._M_value = _Var2._M_value;
  if ((_Var2._M_value == (FieldDescriptor *)0x0) &&
     (name_00._M_str = camelcase_name._M_str, name_00._M_len = (size_t)d,
     _Var3._M_value = Descriptor::FindFieldByName((Descriptor *)this,name_00),
     _Var3._M_value == (FieldDescriptor *)0x0)) {
    bVar5 = 0 < *(int *)(this + 4);
    _Var3._M_value = _Var2._M_value;
    if (0 < *(int *)(this + 4)) {
      index = 0;
      do {
        _Var3._M_value = Descriptor::field((Descriptor *)this,index);
        if (((_Var3._M_value)->field_0x1 & 4) != 0) {
          uVar4 = (ulong)((byte)(_Var3._M_value)->field_0x3 & 0x70);
          __n = *(Desc **)((long)&(_Var3._M_value)->all_names_->_M_string_length + uVar4 * 2);
          if ((__n == d) &&
             ((__n == (Desc *)0x0 ||
              (iVar1 = bcmp(*(void **)((long)&((_Var3._M_value)->all_names_->_M_dataplus)._M_p +
                                      uVar4 * 2),camelcase_name._M_str,(size_t)__n), iVar1 == 0))))
          break;
        }
        index = index + 1;
        bVar5 = index < *(int *)(this + 4);
        _Var3._M_value = _Var2._M_value;
      } while (index < *(int *)(this + 4));
    }
    uVar4 = CONCAT71(uVar6,bVar5);
  }
  oVar7.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._8_8_ = uVar4 & 0xffffffff
  ;
  oVar7.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._M_payload._M_value =
       _Var3._M_value;
  return (optional<const_google::protobuf::FieldDescriptor_*>)
         oVar7.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>.
         _M_payload.super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>;
}

Assistant:

static absl::optional<Field> FieldByName(const Desc& d,
                                           absl::string_view name) {
    if (const auto* field = d.FindFieldByCamelcaseName(name)) {
      return field;
    }

    if (const auto* field = d.FindFieldByName(name)) {
      return field;
    }

    for (int i = 0; i < d.field_count(); ++i) {
      const auto* field = d.field(i);
      if (field->has_json_name() && field->json_name() == name) {
        return field;
      }
    }

    return absl::nullopt;
  }